

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int jx9_hashmap_values(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  long lVar1;
  jx9_hashmap_node *pNode;
  jx9_value *pValue;
  jx9_value *pValue_00;
  uint uVar2;
  jx9_hashmap_node **ppjVar3;
  
  if ((0 < nArg) && (((*apArg)->iFlags & 0x40) != 0)) {
    lVar1 = ((*apArg)->x).iVal;
    pValue = jx9_context_new_array(pCtx);
    if (pValue != (jx9_value *)0x0) {
      ppjVar3 = (jx9_hashmap_node **)(lVar1 + 0x10);
      for (uVar2 = 0; uVar2 < *(uint *)(lVar1 + 0x2c); uVar2 = uVar2 + 1) {
        pNode = *ppjVar3;
        pValue_00 = HashmapExtractNodeValue(pNode);
        if (pValue_00 != (jx9_value *)0x0) {
          jx9_array_add_elem(pValue,(jx9_value *)0x0,pValue_00);
        }
        ppjVar3 = &pNode->pPrev;
      }
      jx9_result_value(pCtx,pValue);
      return 0;
    }
  }
  jx9_result_null(pCtx);
  return 0;
}

Assistant:

static int jx9_hashmap_values(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	jx9_hashmap_node *pNode;
	jx9_hashmap *pMap;
	jx9_value *pArray;
	jx9_value *pObj;
	sxu32 n;
	if( nArg < 1 ){
		/* Missing arguments, return NULL */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	/* Make sure we are dealing with a valid hashmap */
	if( !jx9_value_is_json_array(apArg[0]) ){
		/* Invalid argument, return NULL */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	/* Point to the internal representation that describe the input hashmap */
	pMap = (jx9_hashmap *)apArg[0]->x.pOther;
	/* Create a new array */
	pArray = jx9_context_new_array(pCtx);
	if( pArray == 0 ){
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	/* Perform the requested operation */
	pNode = pMap->pFirst;
	for( n = 0 ; n < pMap->nEntry ; ++n ){
		pObj = HashmapExtractNodeValue(pNode);
		if( pObj ){
			/* perform the insertion */
			jx9_array_add_elem(pArray, 0/* Automatic index assign */, pObj);
		}
		/* Point to the next entry */
		pNode = pNode->pPrev; /* Reverse link */
	}
	/* return the new array */
	jx9_result_value(pCtx, pArray);
	return JX9_OK;
}